

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserKeyword.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserKeyword::ParseValue
          (PropertyParserKeyword *this,Property *property,String *value,ParameterMap *parameters)

{
  bool bVar1;
  reference ppVar2;
  const_iterator cVar3;
  Variant local_c8;
  const_iterator local_a0 [2];
  String local_80;
  String local_60;
  undefined1 local_40 [8];
  const_iterator iterator;
  ParameterMap *parameters_local;
  String *value_local;
  Property *property_local;
  PropertyParserKeyword *this_local;
  
  iterator.mInfo = (uint8_t *)parameters;
  ::std::__cxx11::string::string((string *)&local_80,(string *)value);
  StringUtilities::ToLower(&local_60,&local_80);
  cVar3 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(parameters,&local_60);
  iterator.mKeyVals = (NodePtr)cVar3.mInfo;
  local_40 = (undefined1  [8])cVar3.mKeyVals;
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  local_a0[0] = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)iterator.mInfo);
  bVar1 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::Iter<true>::operator==((Iter<true> *)local_40,local_a0);
  if (!bVar1) {
    ppVar2 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<true>::operator*((Iter<true> *)local_40);
    Variant::Variant<int_const&,void>(&local_c8,&ppVar2->second);
    Variant::operator=(&property->value,&local_c8);
    Variant::~Variant(&local_c8);
    property->unit = KEYWORD;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool PropertyParserKeyword::ParseValue(Property& property, const String& value, const ParameterMap& parameters) const
{
	ParameterMap::const_iterator iterator = parameters.find(StringUtilities::ToLower(value));
	if (iterator == parameters.end())
		return false;

	property.value = Variant((*iterator).second);
	property.unit = Unit::KEYWORD;

	return true;
}